

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void duckdb_je_free(void *ptr)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  uVar4 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  if ((*(ulong *)(lVar1 + -0x28d8 + uVar4) == ((ulong)ptr & 0xffffffffc0000000)) &&
     (uVar4 = *(ulong *)(*(long *)(uVar4 + lVar1 + -0x2a90 + 0x1c0) +
                        (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8)), (uVar4 & 1) != 0)) {
    uVar4 = uVar4 >> 0x30;
    uVar3 = duckdb_je_sz_index2size_tab[uVar4] + *(long *)(lVar1 + -0x2740);
    if (uVar3 < *(ulong *)(lVar1 + -0x2738)) {
      lVar5 = uVar4 * 0x18;
      lVar2 = *(long *)(lVar1 + -0x2728 + lVar5);
      if (*(short *)(lVar1 + -0x2716 + lVar5) != (short)lVar2) {
        *(long *)(lVar5 + lVar1 + -0x2a90 + 0x368) = lVar2 + -8;
        *(void **)(lVar2 + -8) = ptr;
        *(ulong *)(lVar1 + -0x2740) = uVar3;
        return;
      }
    }
  }
  duckdb_je_free_default(ptr);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_free(void *ptr) {
	LOG("core.free.entry", "ptr: %p", ptr);

	je_free_impl(ptr);

	LOG("core.free.exit", "");
}